

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O2

void MemoryLeakWarningPlugin::destroyGlobalDetector(void)

{
  turnOffNewDeleteOverloads();
  if (globalDetector != (MemoryLeakDetector *)0x0) {
    (*globalDetector->_vptr_MemoryLeakDetector[1])();
  }
  if (globalReporter != (MemoryLeakFailure *)0x0) {
    (*globalReporter->_vptr_MemoryLeakFailure[1])();
  }
  globalDetector = (MemoryLeakDetector *)0x0;
  return;
}

Assistant:

void MemoryLeakWarningPlugin::destroyGlobalDetector()
{
    turnOffNewDeleteOverloads();
    delete globalDetector;
    delete globalReporter;
    globalDetector = NULLPTR;
}